

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepComputeState(void *arkode_mem,N_Vector zcor,N_Vector z)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepComputeState",&local_18,&local_20);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,local_20->zpred,1.0,zcor,z);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MRIStepComputeState(void *arkode_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepComputeState",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return(ARK_SUCCESS);
}